

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O0

void __thiscall sqlite::Connection::Stmt::reset(Stmt *this)

{
  int iVar1;
  undefined8 uVar2;
  sqlite3 *db;
  char *pcVar3;
  string *in_RDI;
  int status;
  char *in_stack_ffffffffffffff50;
  allocator *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 uVar5;
  allocator in_stack_ffffffffffffff7f;
  Logic_error *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  
  iVar1 = sqlite3_reset(*(undefined8 *)in_RDI);
  if (iVar1 != 0) {
    uVar5 = 1;
    uVar2 = __cxa_allocate_exception(0x48);
    s_abi_cxx11_(in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff80);
    db = (sqlite3 *)sqlite3_errmsg(*(undefined8 *)(in_RDI + 8));
    std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    pcVar3 = (char *)sqlite3_sql(*(undefined8 *)in_RDI);
    paVar4 = (allocator *)&stack0xffffffffffffff7f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffff80,pcVar3,paVar4);
    Logic_error::Logic_error
              (in_stack_ffffffffffffff80,
               (string *)
               CONCAT17(in_stack_ffffffffffffff7f,CONCAT16(uVar5,in_stack_ffffffffffffff78)),in_RDI,
               (int)((ulong)uVar2 >> 0x20),db);
    __cxa_throw(uVar2,&Logic_error::typeinfo,Logic_error::~Logic_error);
  }
  return;
}

Assistant:

void Connection::Stmt::reset()
    {
        int status = sqlite3_reset(stmt_);
        if(status != SQLITE_OK)
        {
            throw Logic_error("Error resetting statement: "s +
                sqlite3_errmsg(db_), sqlite3_sql(stmt_), status, db_);
        }
    }